

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

string * __thiscall
QPDFJob::getMessagePrefix_abi_cxx11_(string *__return_storage_ptr__,QPDFJob *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              message_prefix);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFJob::getMessagePrefix() const
{
    return m->message_prefix;
}